

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O3

void duckdb::StrpTimeFunction::Parse<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  BoundFunctionExpression *pBVar1;
  pointer pFVar2;
  reference pvVar3;
  UnifiedVectorFormat format_unified;
  pointer local_70;
  UnifiedVectorFormat local_68;
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar2 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar1->bind_info);
  count = args->count;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar3,count,&local_68);
  if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
       (unsigned_long *)0x0) ||
     ((*local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)) {
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    local_70 = pFVar2;
    UnaryExecutor::
    ExecuteStandard<duckdb::string_t,duckdb::timestamp_t,duckdb::UnaryLambdaWrapper,duckdb::StrpTimeFunction::Parse<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_>
              (pvVar3,result,args->count,&local_70,false,CAN_THROW_RUNTIME_ERROR);
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
  }
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Parse(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<StrpTimeBindData>();

		//	There is a bizarre situation where the format column is foldable but not constant
		//	(i.e., the statistics tell us it has only one value)
		//	We have to check whether that value is NULL
		const auto count = args.size();
		UnifiedVectorFormat format_unified;
		args.data[1].ToUnifiedFormat(count, format_unified);

		if (!format_unified.validity.RowIsValid(0)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}
		UnaryExecutor::Execute<string_t, T>(args.data[0], result, args.size(), [&](string_t input) {
			StrpTimeFormat::ParseResult result;
			for (auto &format : info.formats) {
				if (format.Parse(input, result)) {
					return StrpTimeResult<T>(result);
				}
			}
			throw InvalidInputException(result.FormatError(input, info.formats[0].format_specifier));
		});
	}